

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O1

void __thiscall CEObservation::copy_members(CEObservation *this,CEObservation *other)

{
  CEDate *pCVar1;
  double dVar2;
  
  pCVar1 = other->date_;
  this->body_ = other->body_;
  this->date_ = pCVar1;
  this->observer_ = other->observer_;
  this->cached_date_ = other->cached_date_;
  CESkyCoord::operator=(&this->cached_coords_,&other->cached_coords_);
  dVar2 = other->cached_apparentxcoord_;
  this->cached_hour_angle_ = other->cached_hour_angle_;
  this->cached_apparentxcoord_ = dVar2;
  this->cached_apparentycoord_ = other->cached_apparentycoord_;
  return;
}

Assistant:

void CEObservation::copy_members(const CEObservation& other)
{
    // Copy the pointers (this object does not own them)
    body_     = other.body_;
    date_     = other.date_;
    observer_ = other.observer_;

    // Copy the cached values
    cached_date_       = other.cached_date_;
    cached_coords_     = other.cached_coords_;
    cached_hour_angle_ = other.cached_hour_angle_;
    cached_apparentxcoord_ = other.cached_apparentxcoord_;
    cached_apparentycoord_ = other.cached_apparentycoord_;
}